

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O0

overlap_iterator * __thiscall
slang::IntervalMap<int,_int,_0U>::find(IntervalMap<int,_int,_0U> *this,int left,int right)

{
  IntervalMap<int,_int,_0U> *in_RDI;
  overlap_iterator *it;
  overlap_iterator *in_stack_ffffffffffffffd0;
  
  overlap_iterator::overlap_iterator
            (in_stack_ffffffffffffffd0,in_RDI,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  overlap_iterator::setToBegin((overlap_iterator *)in_RDI);
  return (overlap_iterator *)in_RDI;
}

Assistant:

overlap_iterator find(TKey left, TKey right) const {
        overlap_iterator it(*this, left, right);
        it.setToBegin();
        return it;
    }